

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> wabt::MakeUnique<wabt::TryExpr>(void)

{
  TryExpr *this;
  __uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true> in_RDI;
  Location local_30;
  
  this = (TryExpr *)operator_new(0x130);
  Location::Location(&local_30);
  TryExpr::TryExpr(this,&local_30);
  std::unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>>::
  unique_ptr<std::default_delete<wabt::TryExpr>,void>
            ((unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>> *)
             in_RDI.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
             super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
             super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
         (tuple<wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>)
         in_RDI.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
         super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
         super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}